

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O0

int rops_init_vhost_h2(lws_vhost *vh,lws_context_creation_info *info)

{
  int local_1c;
  int n;
  lws_context_creation_info *info_local;
  lws_vhost *vh_local;
  
  memcpy(&vh->h2,&vh->context->set,0x24);
  if (info->http2_settings[0] != 0) {
    for (local_1c = 1; local_1c < 6; local_1c = local_1c + 1) {
      (vh->h2).set.s[local_1c] = info->http2_settings[local_1c];
    }
  }
  return 0;
}

Assistant:

static int
rops_init_vhost_h2(struct lws_vhost *vh,
		   const struct lws_context_creation_info *info)
{
	vh->h2.set = vh->context->set;
	if (info->http2_settings[0]) {
		int n;

		for (n = 1; n < LWS_H2_SETTINGS_LEN; n++)
			vh->h2.set.s[n] = info->http2_settings[n];
	}

	return 0;
}